

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

void * omp_target_alloc(size_t size,int device_num)

{
  bool bVar1;
  void *pvVar2;
  
  if (size != 0) {
    if (device_num == -10) {
      pvVar2 = malloc(size);
      return pvVar2;
    }
    bVar1 = device_is_ready(device_num);
    if (bVar1) {
      pvVar2 = (*(Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                  super__Vector_impl_data._M_start[device_num].RTL)->data_alloc)
                         (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                          super__Vector_impl_data._M_start[device_num].RTLDeviceID,size,(void *)0x0)
      ;
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

EXTERN void *omp_target_alloc(size_t size, int device_num) {
  DP("Call to omp_target_alloc for device %d requesting %zu bytes\n",
      device_num, size);

  if (size <= 0) {
    DP("Call to omp_target_alloc with non-positive length\n");
    return NULL;
  }

  void *rc = NULL;

  if (device_num == omp_get_initial_device()) {
    rc = malloc(size);
    DP("omp_target_alloc returns host ptr " DPxMOD "\n", DPxPTR(rc));
    return rc;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_alloc returns NULL ptr\n");
    return NULL;
  }

  DeviceTy &Device = Devices[device_num];
  rc = Device.RTL->data_alloc(Device.RTLDeviceID, size, NULL);
  DP("omp_target_alloc returns device ptr " DPxMOD "\n", DPxPTR(rc));
  return rc;
}